

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reducer_impl.cpp
# Opt level: O3

elem * cilkred_map::grow(__cilkrts_worker *w,bucket **bp)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  bucket *pbVar3;
  undefined8 uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  elem *peVar7;
  size_t sVar8;
  bucket *pbVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  void **ppvVar14;
  ulong uVar15;
  ulong uVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  
  pbVar3 = *bp;
  if ((pbVar3 == (bucket *)0x0) || (uVar16 = pbVar3->nmax, uVar16 == 0)) {
    uVar16 = 0;
  }
  else {
    peVar7 = pbVar3->el;
    uVar11 = uVar16;
    do {
      if (peVar7->key == (void *)0x0) {
        return peVar7;
      }
      peVar7 = peVar7 + 1;
      uVar11 = uVar11 - 1;
    } while (uVar11 != 0);
  }
  sVar8 = __cilkrts_frame_malloc_roundup(uVar16 * 0x30 + 0x20);
  uVar11 = (sVar8 - 0x20) / 0x18;
  pbVar9 = (bucket *)__cilkrts_frame_malloc(w,uVar11 * 0x18 + 0x20);
  pbVar9->nmax = uVar11;
  if (uVar16 != 0) {
    lVar10 = 8;
    uVar12 = uVar16;
    do {
      *(undefined8 *)((long)&pbVar9->el[0].hb + lVar10) =
           *(undefined8 *)((long)&pbVar3->el[0].hb + lVar10);
      puVar2 = (undefined8 *)((long)pbVar3->el + lVar10 + -8);
      uVar4 = puVar2[1];
      puVar1 = (undefined8 *)((long)pbVar9->el + lVar10 + -8);
      *puVar1 = *puVar2;
      puVar1[1] = uVar4;
      lVar10 = lVar10 + 0x18;
      uVar12 = uVar12 - 1;
    } while (uVar12 != 0);
  }
  pbVar3 = *bp;
  if (pbVar3 != (bucket *)0x0) {
    __cilkrts_frame_free(w,pbVar3,pbVar3->nmax * 0x18 + 0x20);
  }
  *bp = pbVar9;
  auVar6 = _DAT_00112d70;
  auVar5 = _DAT_00112d60;
  lVar10 = uVar11 - uVar16;
  uVar12 = uVar16;
  if (uVar16 <= uVar11 && lVar10 != 0) {
    lVar13 = lVar10 + -1;
    auVar17._8_4_ = (int)lVar13;
    auVar17._0_8_ = lVar13;
    auVar17._12_4_ = (int)((ulong)lVar13 >> 0x20);
    ppvVar14 = &pbVar9[1].el[uVar16 - 1].view;
    uVar15 = 0;
    auVar17 = auVar17 ^ _DAT_00112d70;
    do {
      auVar18._8_4_ = (int)uVar15;
      auVar18._0_8_ = uVar15;
      auVar18._12_4_ = (int)(uVar15 >> 0x20);
      auVar18 = (auVar18 | auVar5) ^ auVar6;
      if ((bool)(~(auVar18._4_4_ == auVar17._4_4_ && auVar17._0_4_ < auVar18._0_4_ ||
                  auVar17._4_4_ < auVar18._4_4_) & 1)) {
        ppvVar14[-3] = (void *)0x0;
      }
      if ((auVar18._12_4_ != auVar17._12_4_ || auVar18._8_4_ <= auVar17._8_4_) &&
          auVar18._12_4_ <= auVar17._12_4_) {
        *ppvVar14 = (void *)0x0;
      }
      uVar15 = uVar15 + 2;
      ppvVar14 = ppvVar14 + 6;
      uVar12 = uVar11;
    } while ((lVar10 + 1U & 0xfffffffffffffffe) != uVar15);
  }
  pbVar9->el[uVar12].key = (void *)0x0;
  return pbVar9->el + uVar16;
}

Assistant:

elem *cilkred_map::grow(__cilkrts_worker *w, 
                        bucket          **bp)
{
    size_t i, nmax, nnmax;
    bucket *b, *nb;

    b = *bp;
    if (b) {
        nmax = b->nmax;
        /* find empty element if any */
        for (i = 0; i < nmax; ++i) 
            if (b->el[i].key == 0) 
                return &(b->el[i]);
        /* do not use the last one even if empty */
    } else {
        nmax = 0;
    }

    verify_current_wkr(w);
    /* allocate a new bucket */
    nnmax = roundup(2 * nmax);
    nb = alloc_bucket(w, nnmax);


    /* copy old bucket into new */
    for (i = 0; i < nmax; ++i)
        nb->el[i] = b->el[i];
     
    free_bucket(w, bp); *bp = nb;

    /* zero out extra elements */
    for (; i < nnmax; ++i)
        nb->el[i].key = 0;

    /* zero out the last one */
    nb->el[i].key = 0;
  
    return &(nb->el[nmax]);
}